

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O2

bool __thiscall cmCTestSubmitCommand::CheckArgumentValue(cmCTestSubmitCommand *this,string *arg)

{
  cmMakefile *pcVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  Part p;
  string local_1b0;
  ostringstream e;
  
  switch((this->super_cmCTestHandlerCommand).ArgumentDoing) {
  case 3:
    p = cmCTest::GetPartFromName
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                   (arg->_M_dataplus)._M_p);
    if (p != PartCount) {
      std::
      _Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
      ::_M_insert_unique<cmCTest::Part_const&>
                ((_Rb_tree<cmCTest::Part,cmCTest::Part,std::_Identity<cmCTest::Part>,std::less<cmCTest::Part>,std::allocator<cmCTest::Part>>
                  *)&this->Parts,&p);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"Part name \"");
    poVar3 = std::operator<<(poVar3,(string *)arg);
    std::operator<<(poVar3,"\" is invalid.");
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1b0);
    goto LAB_00180652;
  case 4:
    bVar2 = cmsys::SystemTools::FileExists(arg);
    if (bVar2) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->Files,arg);
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar3 = std::operator<<((ostream *)&e,"File \"");
    poVar3 = std::operator<<(poVar3,(string *)arg);
    poVar3 = std::operator<<(poVar3,"\" does not exist. Cannot submit ");
    std::operator<<(poVar3,"a non-existent file.");
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1b0);
LAB_00180652:
    std::__cxx11::string::~string((string *)&local_1b0);
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return true;
  case 5:
    psVar4 = (string *)&this->RetryDelay;
    break;
  case 6:
    psVar4 = (string *)&this->RetryCount;
    break;
  case 7:
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    psVar4 = (string *)&this->CDashUploadFile;
    break;
  case 8:
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    psVar4 = (string *)&this->CDashUploadType;
    break;
  case 9:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->HttpHeaders,arg);
    return true;
  case 10:
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 0;
    psVar4 = (string *)&this->SubmitURL;
    break;
  default:
    bVar2 = cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
    return bVar2;
  }
  std::__cxx11::string::_M_assign(psVar4);
  return true;
}

Assistant:

bool cmCTestSubmitCommand::CheckArgumentValue(std::string const& arg)
{
  // Handle states specific to this command.
  if (this->ArgumentDoing == ArgumentDoingParts) {
    cmCTest::Part p = this->CTest->GetPartFromName(arg.c_str());
    if (p != cmCTest::PartCount) {
      this->Parts.insert(p);
    } else {
      std::ostringstream e;
      e << "Part name \"" << arg << "\" is invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
    }
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingFiles) {
    if (cmSystemTools::FileExists(arg)) {
      this->Files.insert(arg);
    } else {
      std::ostringstream e;
      e << "File \"" << arg << "\" does not exist. Cannot submit "
        << "a non-existent file.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
    }
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingHttpHeader) {
    this->HttpHeaders.push_back(arg);
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingRetryCount) {
    this->RetryCount = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingRetryDelay) {
    this->RetryDelay = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingCDashUpload) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->CDashUploadFile = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingCDashUploadType) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->CDashUploadType = arg;
    return true;
  }

  if (this->ArgumentDoing == ArgumentDoingSubmitURL) {
    this->ArgumentDoing = ArgumentDoingNone;
    this->SubmitURL = arg;
    return true;
  }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}